

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sin.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *this;
  uint uVar4;
  double dVar5;
  int output_length;
  int tmp;
  double period;
  double amplitude;
  ostringstream error_message;
  int local_1fc;
  string local_1f8;
  uint local_1d4;
  double local_1d0;
  ulong local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1fc = -1;
  local_1d0 = 10.0;
  local_1c0 = 1.0;
  local_1c8 = 0;
  do {
    iVar3 = ya_getopt_long(argc,argv,"l:m:p:a:o:h",(option *)0x0,(int *)0x0);
    switch(iVar3) {
    case 0x68:
      anon_unknown.dwarf_225e::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
switchD_001026bb_caseD_69:
      anon_unknown.dwarf_225e::PrintUsage((ostream *)&std::cerr);
      return 1;
    case 0x6c:
      std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_1f8);
      bVar2 = sptk::ConvertStringToInteger(local_1a8,&local_1fc);
      bVar1 = local_1fc < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if (!bVar2 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The argument for the -l option must be a positive integer",
                   0x39);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"sin","");
        sptk::PrintErrorMessage(&local_1f8,(ostringstream *)local_1a8);
        goto LAB_00102c70;
      }
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_1f8);
      bVar1 = sptk::ConvertStringToInteger(local_1a8,&local_1fc);
      bVar2 = local_1fc < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "The argument for the -m option must be a non-negative integer",0x3d);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"sin","");
        sptk::PrintErrorMessage(&local_1f8,(ostringstream *)local_1a8);
        goto LAB_00102c70;
      }
      local_1fc = local_1fc + 1;
      break;
    case 0x6f:
      std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_1f8);
      bVar1 = sptk::ConvertStringToInteger(local_1a8,(int *)&local_1d4);
      if (bVar1) {
        bVar1 = sptk::IsInRange(local_1d4,0,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        if (bVar1) {
          local_1c8 = (ulong)local_1d4;
          break;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The argument for the -o option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"in the range of ",0x10);
      this = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0);
      std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
      std::ostream::operator<<((ostream *)this,1);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"sin","");
      sptk::PrintErrorMessage(&local_1f8,(ostringstream *)local_1a8);
      goto LAB_00102c70;
    case 0x70:
      std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_1f8);
      bVar2 = sptk::ConvertStringToDouble(local_1a8,&local_1d0);
      bVar1 = local_1d0 <= 0.0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if (!bVar2 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The argument for the -p option must be a positive number",
                   0x38);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"sin","");
        sptk::PrintErrorMessage(&local_1f8,(ostringstream *)local_1a8);
        goto LAB_00102c70;
      }
      break;
    default:
      if (iVar3 != 0x61) {
        if (iVar3 != -1) goto switchD_001026bb_caseD_69;
        if (ya_optind == argc) {
          bVar1 = sptk::SetBinaryMode();
          if (bVar1) {
            if (local_1fc != -1 && local_1fc < 1) {
              return 0;
            }
            uVar4 = (uint)local_1c8;
            if (1 < uVar4) {
              return 1;
            }
            local_1b8 = 6.283185307179586 / local_1d0;
            iVar3 = 1;
            while( true ) {
              local_1b0 = local_1c0;
              dVar5 = (double)(iVar3 + -1) * local_1b8;
              if (uVar4 == 0) {
                dVar5 = sin(dVar5);
              }
              else {
                dVar5 = cos(dVar5);
              }
              bVar1 = sptk::WriteStream<double>(local_1b0 * dVar5,(ostream *)&std::cout);
              if (!bVar1) break;
              bVar1 = local_1fc <= iVar3;
              iVar3 = iVar3 + 1;
              if (local_1fc != -1 && bVar1) {
                return 0;
              }
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Failed to write sinusoidal sequence",0x23);
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"sin","");
            sptk::PrintErrorMessage(&local_1f8,(ostringstream *)local_1a8);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Cannot set translation mode",0x1b);
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"sin","");
            sptk::PrintErrorMessage(&local_1f8,(ostringstream *)local_1a8);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Input file is not required",0x1a);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"sin","");
          sptk::PrintErrorMessage(&local_1f8,(ostringstream *)local_1a8);
        }
        goto LAB_00102c70;
      }
      std::__cxx11::string::string((string *)local_1a8,ya_optarg,(allocator *)&local_1f8);
      bVar1 = sptk::ConvertStringToDouble(local_1a8,&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The argument for the -a option must be numeric",0x2e);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"sin","");
        sptk::PrintErrorMessage(&local_1f8,(ostringstream *)local_1a8);
LAB_00102c70:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return 1;
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
  int output_length(kMagicNumberForInfinity);
  double period(kDefaultPeriod);
  double amplitude(kDefaultAmplitude);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:p:a:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &output_length) ||
            output_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &output_length) ||
            output_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        ++output_length;
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToDouble(optarg, &period) || period <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive number";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &amplitude)) {
          std::ostringstream error_message;
          error_message << "The argument for the -a option must be numeric";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (0 != argc - optind) {
    std::ostringstream error_message;
    error_message << "Input file is not required";
    sptk::PrintErrorMessage("sin", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("sin", error_message);
    return 1;
  }

  const double omega(sptk::kTwoPi / period);
  for (int i(0); kMagicNumberForInfinity == output_length || i < output_length;
       ++i) {
    double output;
    switch (output_format) {
      case kSine: {
        output = amplitude * std::sin(omega * i);
        break;
      }
      case kCosine: {
        output = amplitude * std::cos(omega * i);
        break;
      }
      default: {
        return 1;
      }
    }
    if (!sptk::WriteStream(output, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write sinusoidal sequence";
      sptk::PrintErrorMessage("sin", error_message);
      return 1;
    }
  }

  return 0;
}